

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

bool __thiscall clickhouse::Client::Impl::ReceiveException(Impl *this,bool rethrow)

{
  CodedInputStream *input;
  QueryEvents *pQVar1;
  bool bVar2;
  __uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> this_00;
  Exception *this_01;
  ServerException *this_02;
  bool has_nested;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> e;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> local_38;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>.
  super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
       (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
       operator_new(0x70);
  Exception::Exception
            ((Exception *)
             this_00._M_t.
             super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
             .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl);
  input = &this->input_;
  e._M_t.super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>.
  _M_t.super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>.
  super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
       (__uniq_ptr_data<clickhouse::Exception,_std::default_delete<clickhouse::Exception>,_true,_true>
        )(__uniq_ptr_data<clickhouse::Exception,_std::default_delete<clickhouse::Exception>,_true,_true>
          )this_00._M_t.
           super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
           .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl;
  while( true ) {
    has_nested = false;
    bVar2 = WireFormat::ReadFixed<int>
                      (input,(int *)this_00._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl);
    if (!bVar2) break;
    bVar2 = WireFormat::ReadString
                      (input,(string *)
                             ((long)this_00._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl + 8));
    if (!bVar2) break;
    bVar2 = WireFormat::ReadString
                      (input,(string *)
                             ((long)this_00._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl + 0x28));
    if (!bVar2) break;
    bVar2 = WireFormat::ReadString
                      (input,(string *)
                             ((long)this_00._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl + 0x48));
    if (!bVar2) break;
    bVar2 = WireFormat::ReadFixed<bool>(input,&has_nested);
    if (!bVar2) break;
    if (has_nested != true) {
      pQVar1 = this->events_;
      if (pQVar1 != (QueryEvents *)0x0) {
        (*pQVar1->_vptr_QueryEvents[5])
                  (pQVar1,e._M_t.
                          super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                          .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl);
      }
      if ((rethrow) || (bVar2 = true, (this->options_).rethrow_exceptions == true)) {
        this_02 = (ServerException *)__cxa_allocate_exception(0x18);
        local_38 = (unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>)
                   (unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>)
                   e._M_t.
                   super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                   .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl;
        e._M_t.
        super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>.
        _M_t.
        super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
        .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
             (__uniq_ptr_data<clickhouse::Exception,_std::default_delete<clickhouse::Exception>,_true,_true>
              )(__uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>)
               0x0;
        ServerException::ServerException(this_02,&local_38);
        __cxa_throw(this_02,&ServerException::typeinfo,ServerException::~ServerException);
      }
      goto LAB_0016536d;
    }
    this_01 = (Exception *)operator_new(0x70);
    Exception::Exception(this_01);
    std::__uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>::reset
              ((__uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                *)((long)this_00._M_t.
                         super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                         .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl + 0x68)
               ,this_01);
    this_00._M_t.
    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>.
    super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
         (((unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> *)
          ((long)this_00._M_t.
                 super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                 .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl + 0x68))->_M_t)
         .super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>.
         _M_t;
  }
  bVar2 = false;
LAB_0016536d:
  std::unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>::~unique_ptr
            (&e);
  return bVar2;
}

Assistant:

bool Client::Impl::ReceiveException(bool rethrow) {
    std::unique_ptr<Exception> e(new Exception);
    Exception* current = e.get();

    do {
        bool has_nested = false;

        if (!WireFormat::ReadFixed(&input_, &current->code)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->name)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->display_text)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->stack_trace)) {
            return false;
        }
        if (!WireFormat::ReadFixed(&input_, &has_nested)) {
            return false;
        }

        if (has_nested) {
            current->nested.reset(new Exception);
            current = current->nested.get();
        } else {
            break;
        }
    } while (true);

    if (events_) {
        events_->OnServerException(*e);
    }

    if (rethrow || options_.rethrow_exceptions) {
        throw ServerException(std::move(e));
    }

    return true;
}